

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O2

int TVMArrayFromDLPack(DLManagedTensor *from,TVMArrayHandle *out)

{
  NDArray NVar1;
  NDArray local_10;
  
  tvm::runtime::NDArray::FromDLPack(&local_10,from);
  NVar1.data_ = local_10.data_;
  local_10.data_ = (Container *)0x0;
  *out = &(NVar1.data_)->dl_tensor;
  tvm::runtime::NDArray::~NDArray(&local_10);
  return 0;
}

Assistant:

int TVMArrayFromDLPack(DLManagedTensor *from,
                       TVMArrayHandle *out) {
  API_BEGIN();
  *out = NDArray::Internal::MoveAsDLTensor(NDArray::FromDLPack(from));
  API_END();
}